

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * __thiscall rw::Matrix::scale(Matrix *this,V3d *scale,CombineOp op)

{
  undefined1 auStack_a8 [8];
  Matrix scl;
  undefined1 local_5c [8];
  Matrix tmp;
  CombineOp op_local;
  V3d *scale_local;
  Matrix *this_local;
  
  scl._40_8_ = identMat._48_8_;
  scl.pos._0_8_ = identMat._56_8_;
  scl._24_8_ = identMat._32_8_;
  scl.up._0_8_ = identMat._24_8_;
  auStack_a8._4_4_ = SUB84(identMat._0_8_,4);
  auStack_a8._0_4_ = scale->x;
  scl.right.z = (float32)identMat._16_8_;
  scl.flags = (uint32)scale->y;
  scl.at.y = SUB84(identMat._40_8_,4);
  scl.at.x = scale->z;
  scl.right._0_8_ = identMat._8_8_ & 0xfffdffffffffffff;
  tmp.pos.z = (float32)op;
  unique0x100001e4 = scale;
  if (op == COMBINEREPLACE) {
    memcpy(this,auStack_a8,0x40);
  }
  else if (op == COMBINEPRECONCAT) {
    mult((Matrix *)local_5c,(Matrix *)auStack_a8,this);
    memcpy(this,local_5c,0x40);
  }
  else if (op == COMBINEPOSTCONCAT) {
    mult((Matrix *)local_5c,this,(Matrix *)auStack_a8);
    memcpy(this,local_5c,0x40);
  }
  return this;
}

Assistant:

Matrix*
Matrix::scale(const V3d *scale, CombineOp op)
{
	Matrix tmp;
	Matrix scl = identMat;
	scl.right.x = scale->x;
	scl.up.y = scale->y;
	scl.at.z = scale->z;
	scl.flags &= ~IDENTITY;
	switch(op){
	case COMBINEREPLACE:
		*this = scl;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &scl, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &scl);
		*this = tmp;
		break;
	}
	return this;
}